

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O1

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setBlendFuncSeparate
          (COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this,GLenum sourceRGB,GLenum destinationRGB,GLenum sourceAlpha,GLenum destinationAlpha)

{
  GLenum *pGVar1;
  GLenum *pGVar2;
  GLenum *pGVar3;
  GLenum *pGVar4;
  code *pcVar5;
  ulong uVar6;
  
  if (destinationRGB == destinationAlpha && sourceRGB == sourceAlpha) {
    setBlendFunc(this,sourceRGB,destinationRGB);
    return;
  }
  if ((((*this->BlendSourceRGB != sourceRGB) || (*this->BlendDestinationRGB != destinationRGB)) ||
      (*this->BlendSourceAlpha != sourceAlpha)) ||
     ((*this->BlendDestinationAlpha != destinationAlpha || (this->BlendFuncInvalid == true)))) {
    pcVar5 = *(code **)&this->Driver->field_0xab8;
    if ((pcVar5 != (code *)0x0) ||
       (pcVar5 = *(code **)&this->Driver->field_0xab0, pcVar5 != (code *)0x0)) {
      (*pcVar5)(sourceRGB,destinationRGB,sourceAlpha,destinationAlpha);
    }
    if (this->FrameBufferCount != 0) {
      pGVar1 = this->BlendSourceRGB;
      pGVar2 = this->BlendDestinationRGB;
      pGVar3 = this->BlendSourceAlpha;
      pGVar4 = this->BlendDestinationAlpha;
      uVar6 = 0;
      do {
        pGVar1[uVar6] = sourceRGB;
        pGVar2[uVar6] = destinationRGB;
        pGVar3[uVar6] = sourceAlpha;
        pGVar4[uVar6] = destinationAlpha;
        uVar6 = uVar6 + 1;
      } while (uVar6 < this->FrameBufferCount);
    }
    this->BlendFuncInvalid = false;
  }
  return;
}

Assistant:

void setBlendFuncSeparate(GLenum sourceRGB, GLenum destinationRGB, GLenum sourceAlpha, GLenum destinationAlpha)
	{
		if (sourceRGB != sourceAlpha || destinationRGB != destinationAlpha) {
			if (BlendSourceRGB[0] != sourceRGB || BlendDestinationRGB[0] != destinationRGB ||
					BlendSourceAlpha[0] != sourceAlpha || BlendDestinationAlpha[0] != destinationAlpha ||
					BlendFuncInvalid) {
				Driver->irrGlBlendFuncSeparate(sourceRGB, destinationRGB, sourceAlpha, destinationAlpha);

				for (GLuint i = 0; i < FrameBufferCount; ++i) {
					BlendSourceRGB[i] = sourceRGB;
					BlendDestinationRGB[i] = destinationRGB;
					BlendSourceAlpha[i] = sourceAlpha;
					BlendDestinationAlpha[i] = destinationAlpha;
				}

				BlendFuncInvalid = false;
			}
		} else {
			setBlendFunc(sourceRGB, destinationRGB);
		}
	}